

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O0

void __thiscall benchmark::internal::BenchmarkImp::ThreadPerCpu(BenchmarkImp *this)

{
  int iVar1;
  BenchmarkImp *this_local;
  
  if (ThreadPerCpu()::num_cpus == '\0') {
    iVar1 = __cxa_guard_acquire(&ThreadPerCpu()::num_cpus);
    if (iVar1 != 0) {
      ThreadPerCpu::num_cpus = NumCPUs();
      __cxa_guard_release(&ThreadPerCpu()::num_cpus);
    }
  }
  std::vector<int,_std::allocator<int>_>::push_back(&this->thread_counts_,&ThreadPerCpu::num_cpus);
  return;
}

Assistant:

void BenchmarkImp::ThreadPerCpu() {
  static int num_cpus = NumCPUs();
  thread_counts_.push_back(num_cpus);
}